

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_list.c
# Opt level: O1

void opj_procedure_list_destroy(opj_procedure_list_t *p_list)

{
  if (p_list != (opj_procedure_list_t *)0x0) {
    if (p_list->m_procedures != (opj_procedure *)0x0) {
      opj_free(p_list->m_procedures);
    }
    opj_free(p_list);
    return;
  }
  return;
}

Assistant:

void  opj_procedure_list_destroy(opj_procedure_list_t * p_list)
{
    if (! p_list) {
        return;
    }
    /* initialization */
    if (p_list->m_procedures) {
        opj_free(p_list->m_procedures);
    }
    opj_free(p_list);
}